

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexBin.cpp
# Opt level: O2

XMLCh * xercesc_4_0::HexBin::getCanonicalRepresentation(XMLCh *hexData,MemoryManager *manager)

{
  int iVar1;
  XMLCh *toUpperCase;
  
  iVar1 = getDataLength(hexData);
  if (iVar1 == -1) {
    toUpperCase = (XMLCh *)0x0;
  }
  else {
    toUpperCase = XMLString::replicate(hexData,manager);
    XMLString::upperCaseASCII(toUpperCase);
  }
  return toUpperCase;
}

Assistant:

XMLCh* HexBin::getCanonicalRepresentation(const XMLCh*          const hexData
                                        ,       MemoryManager*  const manager)
{

    if (getDataLength(hexData) == -1)
        return 0;

    XMLCh* retStr = XMLString::replicate(hexData, manager);
    XMLString::upperCaseASCII(retStr);

    return retStr;
}